

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O3

int main(void)

{
  char *pcVar1;
  char s [10];
  undefined8 local_28;
  undefined2 local_20;
  
  strtok::tmp = (char *)&local_28;
  local_28 = 0x645f5f63625f615f;
  local_20 = 0x5f;
  strtok::max = strlen((char *)&local_28);
  pcVar1 = _PDCLIB_strtok((char *)&local_28,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)((long)&local_28 + 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x27,"strtok( s, \"_\" ) == &s[1]");
  }
  if (local_28._1_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x28,"s[1] == \'a\'");
  }
  if (local_28._2_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x29,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)((long)&local_28 + 3)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2a,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (local_28._3_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2b,"s[3] == \'b\'");
  }
  if (local_28._4_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2c,"s[4] == \'c\'");
  }
  if (local_28._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2d,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)((long)&local_28 + 7)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2e,"strtok( NULL, \"_\" ) == &s[7]");
  }
  if (local_28._6_1_ != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2f,"s[6] == \'_\'");
  }
  if (local_28._7_1_ != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x30,"s[7] == \'d\'");
  }
  if ((char)local_20 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x31,"s[8] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x32,"strtok( NULL, \"_\" ) == NULL");
  }
  local_28 = CONCAT26(local_28._6_2_,0x6400000000);
  local_28 = CONCAT44(local_28._4_4_,0x635f6261);
  strtok::tmp = (char *)&local_28;
  strtok::max = strlen((char *)&local_28);
  pcVar1 = _PDCLIB_strtok((char *)&local_28,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)&local_28) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x34,"strtok( s, \"_\" ) == &s[0]");
  }
  if ((char)local_28 != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x35,"s[0] == \'a\'");
  }
  if (local_28._1_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x36,"s[1] == \'b\'");
  }
  if (local_28._2_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x37,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)((long)&local_28 + 3)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x38,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (local_28._3_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x39,"s[3] == \'c\'");
  }
  if (local_28._4_1_ != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3a,"s[4] == \'d\'");
  }
  if (local_28._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3b,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&strtok::max,"_",&strtok::tmp);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3c,"strtok( NULL, \"_\" ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "_a_bc__d_";
    TESTCASE( strtok( s, "_" ) == &s[1] );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[7] );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    strcpy( s, "ab_cd" );
    TESTCASE( strtok( s, "_" ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    return TEST_RESULTS;
}